

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line_table_reader_common.h
# Opt level: O1

void IssueExpError(Dwarf_Debug dbg,Dwarf_Error *err,char *msg,Dwarf_Unsigned val)

{
  char *msg_00;
  dwarfstring m;
  char buf [200];
  dwarfstring_s dStack_118;
  char local_f8 [208];
  
  dwarfstring_constructor_static(&dStack_118,local_f8,200);
  dwarfstring_append(&dStack_118,"ERROR: ");
  dwarfstring_append(&dStack_118,msg);
  dwarfstring_append_printf_u(&dStack_118," Bad value: 0x%x",val);
  msg_00 = dwarfstring_string(&dStack_118);
  _dwarf_error_string(dbg,err,0x165,msg_00);
  dwarfstring_destructor(&dStack_118);
  return;
}

Assistant:

static void
IssueExpError(Dwarf_Debug dbg,
    Dwarf_Error *err,
    const char * msg,
    Dwarf_Unsigned val)
{
    dwarfstring m;
    char buf[200];

    dwarfstring_constructor_static(&m, buf,sizeof(buf));
    dwarfstring_append(&m , "ERROR: ");
    dwarfstring_append(&m ,(char *)msg);
    dwarfstring_append_printf_u(&m , " Bad value: 0x%x", val);
    _dwarf_error_string(dbg, err, DW_DLE_LINE_TABLE_BAD,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}